

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvrktest.cpp
# Opt level: O0

Result TestPowerAmplifier(AmpIO **Board,BasePort *Port)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t uVar3;
  ostream *poVar4;
  __type _Var5;
  int local_54;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  undefined1 local_42;
  byte local_41;
  uint32_t local_40;
  bool channel_0_load_driven;
  int iStack_3c;
  bool amp_working;
  uint32_t motor_current;
  uint local_30;
  int local_2c;
  int channel_index;
  int board_index;
  Result result;
  int crossed_db9_error_count;
  BasePort *Port_local;
  AmpIO **Board_local;
  
  board_index = 0;
  channel_index = 0;
  local_2c = 0;
  _result = Port;
  Port_local = (BasePort *)Board;
  do {
    if (NUM_FPGA <= local_2c) {
      if (board_index == 2) {
        channel_index = 2;
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&COLOR_ERROR_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"(DB9 cables are likely crossed!)");
        poVar4 = std::operator<<(poVar4,(string *)&COLOR_OFF_abi_cxx11_);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)logfile,"DB9 cables are likely crossed!");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      if (channel_index == 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&COLOR_ERROR_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"(Are the DB9 cables plugged in?)");
        poVar4 = std::operator<<(poVar4,(string *)&COLOR_OFF_abi_cxx11_);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      return channel_index;
    }
    for (local_30 = 0;
        (((int)local_30 < NUM_CHANNEL_PER_FPGA && ((local_2c != 1 || (local_30 != 3)))) &&
        ((local_2c != 0 || (local_30 != 7)))); local_30 = local_30 + 1) {
      (*_result->_vptr_BasePort[0x1d])();
      uVar3 = AmpIO::GetAnalogInput((AmpIO *)Port_local->_vptr_BasePort,0);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = SUB168(SEXT816((long)0x4000),8);
      _Var5 = std::fabs<long>((ulong)uVar3 -
                              SUB168((auVar1 << 0x40 | ZEXT816(0x4000)) / SEXT816(2),0));
      if (_Var5 < 1280.0) {
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&COLOR_ERROR_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"(unexpected current detected on channel 0)");
        poVar4 = std::operator<<(poVar4,(string *)&COLOR_OFF_abi_cxx11_);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)logfile,"unexpected current detected on channel 0");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        return fatal_fail;
      }
      AmpIO::SetMotorCurrent((AmpIO *)Port_local->BoardList[(long)local_2c + -8],local_30,0x8500);
      (*_result->_vptr_BasePort[0x21])();
      iStack_3c = 200;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&motor_current,&stack0xffffffffffffffc4);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&motor_current);
      (*_result->_vptr_BasePort[0x1d])();
      local_40 = AmpIO::GetMotorCurrent
                           ((AmpIO *)Port_local->BoardList[(long)local_2c + -8],local_30);
      _Var5 = std::fabs<long>((ulong)local_40 - 0x8500);
      local_41 = _Var5 < 512.0;
      uVar3 = AmpIO::GetAnalogInput((AmpIO *)Port_local->_vptr_BasePort,0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = SUB168(SEXT816((long)0x4000),8);
      _Var5 = std::fabs<long>((ulong)uVar3 -
                              SUB168((auVar2 << 0x40 | ZEXT816(0x4000)) / SEXT816(2),0));
      local_42 = _Var5 < 1280.0;
      if ((((local_2c == 0) && (local_30 == 0)) && ((local_41 & 1) != 0)) && (!(bool)local_42)) {
        board_index = board_index + 1;
      }
      if (((local_2c == 1) && (local_30 == 0)) && (((local_41 & 1) != 0 && ((bool)local_42)))) {
        board_index = board_index + 1;
      }
      if (((local_2c == 0) && (local_30 == 4)) && (((local_41 & 1) != 0 && ((bool)local_42)))) {
        board_index = board_index + 1;
      }
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::hex);
      poVar4 = std::operator<<(poVar4,"board ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2c);
      poVar4 = std::operator<<(poVar4," amp channel ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_30);
      poVar4 = std::operator<<(poVar4," - ");
      poVar4 = std::operator<<(poVar4," expected=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8500);
      poVar4 = std::operator<<(poVar4," measured=");
      std::ostream::operator<<(poVar4,local_40);
      poVar4 = (ostream *)std::ostream::operator<<(logfile,std::hex);
      poVar4 = std::operator<<(poVar4,"board ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2c);
      poVar4 = std::operator<<(poVar4," amp channel ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_30);
      poVar4 = std::operator<<(poVar4," - ");
      poVar4 = std::operator<<(poVar4," expected=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8500);
      poVar4 = std::operator<<(poVar4," measured=");
      std::ostream::operator<<(poVar4,local_40);
      if ((local_41 & 1) == 0) {
        channel_index = 1;
        poVar4 = std::operator<<((ostream *)&std::cout," ... \x1b[1;91m[FAIL]\x1b[0m");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)logfile,"... FAIL");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout," ... \x1b[0;32m[PASS]\x1b[0m");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)logfile,"... PASS");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      AmpIO::SetMotorCurrent((AmpIO *)Port_local->BoardList[(long)local_2c + -8],local_30,0x8000);
      (*_result->_vptr_BasePort[0x21])();
      local_54 = 200;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_50,&local_54);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_50);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Result TestPowerAmplifier(AmpIO **Board, BasePort *Port) {
    int crossed_db9_error_count = 0;
    Result result = pass;

    for (int board_index = 0; board_index < NUM_FPGA; board_index++) {
        for (int channel_index = 0; channel_index < NUM_CHANNEL_PER_FPGA; channel_index++) {
            if (board_index == 1 && channel_index == 3) break;
            if (board_index == 0 && channel_index == 7) break;

            Port->ReadAllBoards();

            if (std::fabs((long) Board[0]->GetAnalogInput(0) - (long) POT_TEST_ADC_COUNT[0] / 2) <
                POT_TEST_ADC_ERROR_TOLERANCE) {
                std::cout << COLOR_ERROR << "(unexpected current detected on channel 0)" << COLOR_OFF << std::endl;
                logfile << "unexpected current detected on channel 0" << std::endl;
                return fatal_fail;
            }

            Board[board_index]->SetMotorCurrent(channel_index, POWER_AMP_TEST_DAC);
            Port->WriteAllBoards();
            std::this_thread::sleep_for(std::chrono::milliseconds(200));

            Port->ReadAllBoards();
            auto motor_current = Board[board_index]->GetMotorCurrent(channel_index);
            bool amp_working = std::fabs((long) motor_current - (long) POWER_AMP_TEST_DAC) <
                               POWER_AMP_TEST_TOLERANCE;
            bool channel_0_load_driven =
                    std::fabs((long) Board[0]->GetAnalogInput(0) - (long) POT_TEST_ADC_COUNT[0] / 2) <
                    POT_TEST_ADC_ERROR_TOLERANCE;

            if (board_index == 0 && channel_index == 0 && amp_working && !channel_0_load_driven) {
                crossed_db9_error_count++;
            }

            if (board_index == 1 && channel_index == 0 && amp_working && channel_0_load_driven) {
                crossed_db9_error_count++;
            }

            if (board_index == 0 && channel_index == 4 && amp_working && channel_0_load_driven) {
                crossed_db9_error_count++;
            }

            std::cout << std::hex << "board " << board_index << " amp channel " << channel_index << " - "
                      << " expected="
                      << POWER_AMP_TEST_DAC << " measured=" << motor_current;
            logfile << std::hex << "board " << board_index << " amp channel " << channel_index << " - "
                        << " expected="
                        << POWER_AMP_TEST_DAC << " measured=" << motor_current;

            if (!amp_working) {
                result = fail;
                std::cout << FAIL << std::endl;
                logfile << "... FAIL" << std::endl;
            } else {
                std::cout << PASS << std::endl;
                logfile << "... PASS" << std::endl;
            }

            Board[board_index]->SetMotorCurrent(channel_index, 0x8000);
            Port->WriteAllBoards();
            std::this_thread::sleep_for(std::chrono::milliseconds(200));


        }
    }
    if (crossed_db9_error_count == 2) {
        result = fatal_fail;
        std::cout << COLOR_ERROR << "(DB9 cables are likely crossed!)" << COLOR_OFF << std::endl;
        logfile << "DB9 cables are likely crossed!" << std::endl;
    }

    if (result == fail) {
        std::cout << COLOR_ERROR << "(Are the DB9 cables plugged in?)" << COLOR_OFF << std::endl;
    }

    return result;

}